

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDL::HalfLife::HL1MDLLoader::extract_anim_value
          (HL1MDLLoader *this,AnimValue_HL1 *panimvalue,int frame,float bone_scale,float *value)

{
  uint uVar1;
  int k;
  ulong uVar2;
  AnimValue_HL1 *pAVar3;
  
  uVar1 = (uint)(panimvalue->num).total;
  pAVar3 = panimvalue;
  if ((int)(uint)(panimvalue->num).total <= frame) {
    do {
      frame = frame - uVar1;
      panimvalue = pAVar3 + (ulong)(pAVar3->num).valid + 1;
      uVar1 = (uint)*(byte *)((long)pAVar3 + (ulong)(pAVar3->num).valid * 2 + 3);
      pAVar3 = panimvalue;
    } while ((int)uVar1 <= frame);
  }
  uVar2 = (long)(frame + 1);
  if ((int)(uint)(panimvalue->num).valid <= frame) {
    uVar2 = (ulong)(panimvalue->num).valid;
  }
  *value = (float)(int)panimvalue[uVar2].value * bone_scale;
  return;
}

Assistant:

void HL1MDLLoader::extract_anim_value(
        const AnimValue_HL1 *panimvalue,
        int frame, float bone_scale, float &value) {
    int k = frame;

    // find span of values that includes the frame we want
    while (panimvalue->num.total <= k) {
        k -= panimvalue->num.total;
        panimvalue += panimvalue->num.valid + 1;
    }

    // Bah, missing blend!
    if (panimvalue->num.valid > k)
        value = panimvalue[k + 1].value * bone_scale;
    else
        value = panimvalue[panimvalue->num.valid].value * bone_scale;
}